

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O2

void recff_io_flush(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  TRef TVar2;
  ptrdiff_t pVar3;
  TRef ud;
  
  TVar1 = recff_io_fp(J,&ud,rd->data);
  TVar1 = lj_ir_call(J,IRCALL_fflush,(ulong)TVar1);
  pVar3 = results_wanted(J);
  if (pVar3 != 0) {
    TVar2 = lj_ir_kint(J,0);
    (J->fold).ins.field_0.ot = 0x893;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
    lj_opt_fold(J);
  }
  *J->base = 0x2007ffd;
  return;
}

Assistant:

static void LJ_FASTCALL recff_io_flush(jit_State *J, RecordFFData *rd)
{
  TRef ud, fp = recff_io_fp(J, &ud, rd->data);
  TRef tr = lj_ir_call(J, IRCALL_fflush, fp);
  if (results_wanted(J) != 0)  /* Check result only if not ignored. */
    emitir(IRTGI(IR_EQ), tr, lj_ir_kint(J, 0));
  J->base[0] = TREF_TRUE;
}